

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O1

EStatusCode __thiscall
AbstractContentContext::CS(AbstractContentContext *this,string *inColorSpaceName)

{
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  string local_40;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddProcsetResource
            ((ResourcesDictionary *)CONCAT44(extraout_var,iVar2),&KProcsetPDF_abi_cxx11_);
  PrimitiveObjectsWriter::WriteName(&this->mPrimitiveWriter,inColorSpaceName,eTokenSeparatorSpace);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CS","");
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::CS(const std::string& inColorSpaceName)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteName(inColorSpaceName);
	mPrimitiveWriter.WriteKeyword("CS");
	return GetCurrentStatusCode();
}